

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

v4sf * cfftf1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac,int isign)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int ido;
  int iVar4;
  long lVar5;
  v4sf *ch;
  int l1;
  bool bVar6;
  float fsign;
  
  ch = work2;
  if (input_readonly == work2) {
    ch = work1;
  }
  if ((work1 != work2) && (ch != input_readonly)) {
    uVar2 = ifac[1];
    if (0 < (int)uVar2) {
      fsign = (float)isign;
      iVar4 = 0;
      lVar5 = 2;
      l1 = 1;
      do {
        iVar3 = ifac[lVar5];
        if (3 < iVar3 - 2U) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                        ,0x4a1,
                        "v4sf *cfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *, int)"
                       );
        }
        ido = (n / (iVar3 * l1)) * 2;
        switch(iVar3) {
        case 2:
          passf2_ps(ido,l1,input_readonly,ch,wa + iVar4,fsign);
          break;
        case 3:
          passf3_ps(ido,l1,input_readonly,ch,wa + iVar4,wa + (iVar4 + ido),fsign);
          break;
        case 4:
          passf4_ps(ido,l1,input_readonly,ch,wa + iVar4,wa + (iVar4 + ido),wa + (iVar4 + ido + ido),
                    fsign);
          break;
        case 5:
          iVar1 = iVar4 + ido + ido;
          passf5_ps(ido,l1,input_readonly,ch,wa + iVar4,wa + (iVar4 + ido),wa + iVar1,
                    wa + (iVar1 + ido),fsign);
        }
        iVar4 = iVar4 + ido * (iVar3 + -1);
        bVar6 = ch == work2;
        input_readonly = work1;
        ch = work2;
        if (bVar6) {
          input_readonly = work2;
          ch = work1;
        }
        lVar5 = lVar5 + 1;
        l1 = iVar3 * l1;
      } while ((ulong)uVar2 + 2 != lVar5);
    }
    return input_readonly;
  }
  __assert_fail("in != out && work1 != work2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x487,
                "v4sf *cfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *, int)"
               );
}

Assistant:

v4sf *cfftf1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, const float *wa, const int *ifac, int isign) {
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2); 
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out && work1 != work2);
  for (k1=2; k1<=nf+1; k1++) {
    int ip = ifac[k1];
    int l2 = ip*l1;
    int ido = n / l2;
    int idot = ido + ido;
    switch (ip) {
      case 5: {
        int ix2 = iw + idot;
        int ix3 = ix2 + idot;
        int ix4 = ix3 + idot;
        passf5_ps(idot, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4], isign);
      } break;
      case 4: {
        int ix2 = iw + idot;
        int ix3 = ix2 + idot;
        passf4_ps(idot, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], isign);
      } break;
      case 2: {
        passf2_ps(idot, l1, in, out, &wa[iw], isign);
      } break;
      case 3: {
        int ix2 = iw + idot;
        passf3_ps(idot, l1, in, out, &wa[iw], &wa[ix2], isign);
      } break;
      default:
        assert(0);
    }
    l1 = l2;
    iw += (ip - 1)*idot;
    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }

  return in; /* this is in fact the output .. */
}